

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

double __thiscall
despot::Parser::GetReward
          (Parser *this,vector<int,_std::allocator<int>_> *prev_state,
          vector<int,_std::allocator<int>_> *curr_state,ACT_TYPE action)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer piVar3;
  pointer pFVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  int r;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  pSVar1 = (this->prev_state_vars_).
           super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (this->prev_state_vars_).
           super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar3 = (prev_state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = &(pSVar1->super_NamedVar).super_Variable.curr_value;
  for (lVar6 = 0; ((long)pSVar2 - (long)pSVar1) / 0xc0 != lVar6; lVar6 = lVar6 + 1) {
    *piVar7 = piVar3[lVar6];
    piVar7 = piVar7 + 0x30;
  }
  pSVar1 = (this->curr_state_vars_).
           super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (this->curr_state_vars_).
           super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar3 = (curr_state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = &(pSVar1->super_NamedVar).super_Variable.curr_value;
  for (lVar6 = 0; ((long)pSVar2 - (long)pSVar1) / 0xc0 != lVar6; lVar6 = lVar6 + 1) {
    *piVar7 = piVar3[lVar6];
    piVar7 = piVar7 + 0x30;
  }
  (((this->action_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
    _M_impl.super__Vector_impl_data._M_start)->super_Variable).curr_value = action;
  dVar9 = 0.0;
  lVar6 = 0;
  uVar8 = 0;
  while( true ) {
    pFVar4 = (this->reward_funcs_).
             super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(this->reward_funcs_).
                  super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pFVar4;
    if ((ulong)(lVar5 / 0x58) <= uVar8) break;
    dVar10 = (double)(**(code **)(*(long *)((long)&pFVar4->_vptr_Function + lVar6) + 0x28))
                               ((long)&pFVar4->_vptr_Function + lVar6,0,lVar5 % 0x58);
    dVar9 = dVar9 + dVar10;
    uVar8 = uVar8 + 1;
    lVar6 = lVar6 + 0x58;
  }
  return dVar9;
}

Assistant:

double Parser::GetReward(const vector<int>& prev_state,
	const vector<int>& curr_state, ACT_TYPE action) const {
	for (int s = 0; s < prev_state_vars_.size(); s++)
		prev_state_vars_[s].curr_value = prev_state[s];
	for (int s = 0; s < curr_state_vars_.size(); s++)
		curr_state_vars_[s].curr_value = curr_state[s];
	action_vars_[0].curr_value = action;

	double reward = 0;
	for (int r = 0; r < reward_funcs_.size(); r++)
		reward += reward_funcs_[r].GetValue();
	return reward;
}